

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraExec_cpp.h
# Opt level: O0

void __thiscall
moira::Moira::execCmpm<(moira::Instr)40,(moira::Mode)3,(moira::Size)1>(Moira *this,u16 opcode)

{
  bool bVar1;
  uint uVar2;
  ushort in_SI;
  Moira *in_RDI;
  u32 data2;
  u32 data1;
  u32 ea2;
  u32 ea1;
  int dst;
  int src;
  u32 in_stack_ffffffffffffffd8;
  u32 in_stack_ffffffffffffffdc;
  undefined4 in_stack_ffffffffffffffe0;
  int in_stack_ffffffffffffffe4;
  undefined4 in_stack_ffffffffffffffe8;
  
  uVar2 = (int)(uint)in_SI >> 9 & 7;
  bVar1 = readOp<(moira::Mode)3,(moira::Size)1,64ul>
                    ((Moira *)(CONCAT44((int)(uint)in_SI >> 9,in_stack_ffffffffffffffe8) &
                              0x7ffffffff),in_stack_ffffffffffffffe4,
                     (u32 *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8),
                     (u32 *)in_RDI);
  if ((bVar1) &&
     (bVar1 = readOp<(moira::Mode)3,(moira::Size)1,64ul>
                        ((Moira *)CONCAT44(uVar2,in_stack_ffffffffffffffe8),
                         in_stack_ffffffffffffffe4,
                         (u32 *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8),
                         (u32 *)in_RDI), bVar1)) {
    cmp<(moira::Size)1>((Moira *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
                        in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8);
    prefetch<4ul>(in_RDI);
  }
  return;
}

Assistant:

void
Moira::execCmpm(u16 opcode)
{
    int src = _____________xxx(opcode);
    int dst = ____xxx_________(opcode);

    u32 ea1, ea2, data1, data2;

    if (!readOp<M,S, AE_INC_PC>(src, ea1, data1)) return;
    if (!readOp<M,S, AE_INC_PC>(dst, ea2, data2)) return;

    cmp<S>(data1, data2);
    prefetch<POLLIPL>();
}